

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O0

void __thiscall
FMB::FiniteModelMultiSorted::FiniteModelMultiSorted
          (FiniteModelMultiSorted *this,DArray<unsigned_int> *sortSizes)

{
  long in_RDI;
  DArray<Lib::DArray<int>_> *this_00;
  size_t in_stack_ffffffffffffffa8;
  DArray<unsigned_int> *in_stack_ffffffffffffffb0;
  DArray<unsigned_int> *in_stack_ffffffffffffffb8;
  DArray<unsigned_int> *in_stack_ffffffffffffffc0;
  
  Lib::DArray<unsigned_int>::DArray(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Lib::DArray<unsigned_int>::DArray(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Lib::DArray<unsigned_int>::DArray(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Lib::DArray<unsigned_int>::DArray(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (DArray<Lib::DArray<int>_> *)(in_RDI + 0x60);
  Lib::DArray<char>::DArray((DArray<char> *)this_00,in_stack_ffffffffffffffa8);
  Lib::DArray<Lib::DArray<int>_>::DArray(this_00,in_RDI + 0x78);
  Lib::
  DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::DHMap((DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           *)(in_RDI + 0x90));
  Lib::
  DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::DHMap((DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
           *)(in_RDI + 0xb8));
  initTables(this);
  return;
}

Assistant:

FiniteModelMultiSorted(DArray<unsigned> sortSizes) : _sizes(sortSizes) {
    initTables();
  }